

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QSet<QGesture*>>
          (QtPrivate *this,QDebug debug,char *which,QSet<QGesture_*> *c)

{
  long lVar1;
  undefined8 uVar2;
  QDebug *pQVar3;
  QDebug d;
  QGesture *gesture;
  long in_FS_OFFSET;
  Stream *local_60;
  Stream local_58 [8];
  undefined1 local_50 [16];
  piter local_40;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar3 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar3,'(');
  local_40 = (piter)QHash<QGesture_*,_QHashDummyValue>::begin(&c->q_hash);
  if (local_40.d == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 &&
      local_40.bucket == 0) goto LAB_002dad0b;
  local_50._0_8_ = *(undefined8 *)debug.stream;
  gesture = (QGesture *)local_50;
  *(int *)(local_50._0_8_ + 0x28) = *(int *)(local_50._0_8_ + 0x28) + 1;
  d.stream = (Stream *)(local_50 + 8);
  while( true ) {
    ::operator<<(d,gesture);
    QDebug::~QDebug((QDebug *)d.stream);
    QDebug::~QDebug((QDebug *)gesture);
    QHashPrivate::iterator<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::operator++(&local_40);
LAB_002dad0b:
    if ((local_40.d == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0) &&
       (local_40.bucket == 0)) break;
    pQVar3 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60 = pQVar3->stream;
    gesture = (QGesture *)&local_60;
    *(int *)(local_60 + 0x28) = *(int *)(local_60 + 0x28) + 1;
    d.stream = local_58;
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar2 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}